

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
fixedMeasurement_unaryOps_Test::~fixedMeasurement_unaryOps_Test
          (fixedMeasurement_unaryOps_Test *this)

{
  fixedMeasurement_unaryOps_Test *this_local;
  
  ~fixedMeasurement_unaryOps_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(fixedMeasurement, unaryOps)
{
    fixed_measurement x(2.0, cm);

    auto z = -x;
    auto y = +x;
    EXPECT_EQ(y, x);
    EXPECT_EQ(z.value(), -x.value());
    EXPECT_EQ(z.units(), x.units());
}